

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O0

int test_is_at(int index,...)

{
  bool local_101;
  int *local_100;
  int local_e8 [46];
  long local_30;
  size_t level;
  va_list arg;
  int index_local;
  
  arg[0]._0_8_ = &stack0x00000008;
  level._0_4_ = 8;
  local_30 = 0;
  arg[0].reg_save_area._4_4_ = index;
  while (arg[0].reg_save_area._4_4_ == test_index[local_30] && arg[0].reg_save_area._4_4_ != 0) {
    if ((uint)level < 0x29) {
      local_100 = (int *)((long)local_e8 + (long)(int)(uint)level);
      level._0_4_ = (uint)level + 8;
    }
    else {
      local_100 = (int *)arg[0]._0_8_;
      arg[0]._0_8_ = arg[0]._0_8_ + 8;
    }
    local_30 = local_30 + 1;
    arg[0].reg_save_area._4_4_ = *local_100;
  }
  local_101 = arg[0].reg_save_area._4_4_ == test_index[local_30] && arg[0].reg_save_area._4_4_ == 0;
  return (uint)local_101;
}

Assistant:

int test_is_at(int index, ...)
{
    va_list arg;
    va_start(arg, index);
    size_t level;

    for (level = 0; index == test_index[level] && index != 0; ++level)
        index = va_arg(arg, int);

    va_end(arg);
    return index == test_index[level] && index == 0;
}